

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

int xmlTextWriterWriteRawLen(xmlTextWriterPtr writer,xmlChar *content,int len)

{
  int iVar1;
  xmlLinkPtr lk_00;
  xmlTextWriterStackEntry *p_00;
  xmlTextWriterStackEntry *p;
  xmlLinkPtr lk;
  int sum;
  int count;
  int len_local;
  xmlChar *content_local;
  xmlTextWriterPtr writer_local;
  
  if (writer == (xmlTextWriterPtr)0x0) {
    xmlWriterErrMsg((xmlTextWriterPtr)0x0,XML_ERR_INTERNAL_ERROR,
                    "xmlTextWriterWriteRawLen : invalid writer!\n");
    writer_local._4_4_ = -1;
  }
  else if ((content == (xmlChar *)0x0) || (len < 0)) {
    xmlWriterErrMsg(writer,XML_ERR_INTERNAL_ERROR,"xmlTextWriterWriteRawLen : invalid content!\n");
    writer_local._4_4_ = -1;
  }
  else {
    lk._4_4_ = 0;
    lk_00 = xmlListFront(writer->nodes);
    if (lk_00 != (xmlLinkPtr)0x0) {
      p_00 = (xmlTextWriterStackEntry *)xmlLinkGetData(lk_00);
      lk._4_4_ = xmlTextWriterHandleStateDependencies(writer,p_00);
      if (lk._4_4_ < 0) {
        return -1;
      }
    }
    if (writer->indent != 0) {
      writer->doindent = 0;
    }
    if (content != (xmlChar *)0x0) {
      iVar1 = xmlOutputBufferWrite(writer->out,len,(char *)content);
      if (iVar1 < 0) {
        return -1;
      }
      lk._4_4_ = iVar1 + lk._4_4_;
    }
    writer_local._4_4_ = lk._4_4_;
  }
  return writer_local._4_4_;
}

Assistant:

int
xmlTextWriterWriteRawLen(xmlTextWriterPtr writer, const xmlChar * content,
                         int len)
{
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlTextWriterStackEntry *p;

    if (writer == NULL) {
        xmlWriterErrMsg(writer, XML_ERR_INTERNAL_ERROR,
                        "xmlTextWriterWriteRawLen : invalid writer!\n");
        return -1;
    }

    if ((content == NULL) || (len < 0)) {
        xmlWriterErrMsg(writer, XML_ERR_INTERNAL_ERROR,
                        "xmlTextWriterWriteRawLen : invalid content!\n");
        return -1;
    }

    sum = 0;
    lk = xmlListFront(writer->nodes);
    if (lk != 0) {
        p = (xmlTextWriterStackEntry *) xmlLinkGetData(lk);
        count = xmlTextWriterHandleStateDependencies(writer, p);
        if (count < 0)
            return -1;
        sum += count;
    }

    if (writer->indent)
        writer->doindent = 0;

    if (content != NULL) {
        count =
            xmlOutputBufferWrite(writer->out, len, (const char *) content);
        if (count < 0)
            return -1;
        sum += count;
    }

    return sum;
}